

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_direct.cpp
# Opt level: O2

void __thiscall
direct_solvers_lower_upper_factorisation_death_test_Test::
~direct_solvers_lower_upper_factorisation_death_test_Test
          (direct_solvers_lower_upper_factorisation_death_test_Test *this)

{
  direct_solvers::~direct_solvers(&this->super_direct_solvers);
  operator_delete(this,0x90);
  return;
}

Assistant:

TEST_F(direct_solvers, lower_upper_factorisation_death_test) {

  // Check pivoting mis-match
  Solver_Config data;
  data.type = Solver_Type::lower_upper_factorisation;
  data.pivot = false;
  EXPECT_DEATH(Solver_LUP<0> lup(data), "./*");
  data.pivot = true;
  EXPECT_DEATH(Solver_LU<0> lup(data), "./*");

  // Check incorrect solver type
  data.type = Solver_Type::unknown;  // anything other than lower_upper_factorisation
  data.pivot = false;
  EXPECT_DEATH(Solver_LU<0> lup(data), "./*");
  data.pivot = true;
  EXPECT_DEATH(Solver_LUP<0> lup(data), "./*");

  // incorrect sizes
  Vector_Dense<Scalar, 0> b_vector = {6, 2};
  Vector_Dense<Scalar, 0> x_vector = {0, 0, 0};
  Matrix_Dense<Scalar, 0, 0> matrix = {{2, 7, 6}, {9, 5, 1}, {4, 3, 8}};
  lu_solver.factorise(matrix);
  lup_solver.factorise(matrix);
  EXPECT_DEATH(lu_solver.solve_system(x_vector, b_vector), "./*");
  EXPECT_DEATH(lup_solver.solve_system(x_vector, b_vector), "./*");
}